

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.cc
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,Value *dst)

{
  bool bVar1;
  uint32_t tyid;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_00;
  const_iterator cVar2;
  const_iterator cVar3;
  pointer pSVar4;
  size_type sVar5;
  long *plVar6;
  size_type *psVar7;
  const_reference pvVar8;
  double *pdVar9;
  const_reference pvVar10;
  double dVar11;
  double dVar12;
  bool ret;
  Value *p1;
  Value *p0;
  double local_118;
  double local_110;
  double dt;
  double tu;
  double tl;
  long local_f0 [3];
  size_t idx1;
  Sample *local_d0;
  difference_type local_c8;
  long local_c0 [3];
  size_t idx0;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  local_a0;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  it_minus_1_1;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  local_80;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  it_1;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  local_70;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  it_minus_1;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  local_50;
  __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
  it;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *samples;
  Value *local_30;
  Value *dst_local;
  double dStack_20;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  local_30 = dst;
  dst_local._4_4_ = tinterp;
  dStack_20 = t;
  t_local = (double)this;
  bVar1 = is_blocked(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&samples,dStack_20);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&samples);
    if ((bVar1) && (bVar1 = has_default(this), bVar1)) {
      tinyusdz::value::Value::operator=(local_30,&this->_value);
      this_local._7_1_ = true;
    }
    else {
      bVar1 = has_timesamples(this);
      if (bVar1) {
        this_00 = tinyusdz::value::TimeSamples::get_samples(&this->_ts);
        bVar1 = std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::empty(this_00);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          tinyusdz::value::TimeCode::TimeCode((TimeCode *)&it,dStack_20);
          bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&it);
          if (bVar1) {
            pvVar8 = std::
                     vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ::operator[](this_00,0);
            if ((pvVar8->blocked & 1U) == 0) {
              pvVar8 = std::
                       vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ::operator[](this_00,0);
              tinyusdz::value::Value::operator=(local_30,&pvVar8->value);
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            if (dst_local._4_4_ != Held) {
              tyid = tinyusdz::value::Value::type_id(&this->_value);
              bVar1 = tinyusdz::value::IsLerpSupportedType(tyid);
              if (bVar1) {
                cVar2 = std::
                        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ::begin(this_00);
                cVar3 = std::
                        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ::end(this_00);
                local_80 = std::
                           lower_bound<__gnu_cxx::__normal_iterator<tinyusdz::value::TimeSamples::Sample_const*,std::vector<tinyusdz::value::TimeSamples::Sample,std::allocator<tinyusdz::value::TimeSamples::Sample>>>,double,tinyusdz::primvar::PrimVar::get_interpolated_value(double,tinyusdz::value::TimeSampleInterpolationType,tinyusdz::value::Value*)const::__1>
                                     (cVar2._M_current,cVar3._M_current,&stack0xffffffffffffffe0);
                idx0 = (size_t)std::
                               vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ::begin(this_00);
                bVar1 = __gnu_cxx::operator==
                                  (&local_80,
                                   (__normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
                                    *)&idx0);
                if (bVar1) {
                  local_a0._M_current =
                       (Sample *)
                       std::
                       vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ::begin(this_00);
                }
                else {
                  local_a0 = __gnu_cxx::
                             __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
                             ::operator-(&local_80,1);
                }
                local_c0[1] = 0;
                sVar5 = std::
                        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ::size(this_00);
                local_c0[0] = sVar5 - 1;
                local_d0 = (Sample *)
                           std::
                           vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ::begin(this_00);
                idx1 = (size_t)local_a0._M_current;
                local_c8 = std::
                           distance<__gnu_cxx::__normal_iterator<tinyusdz::value::TimeSamples::Sample_const*,std::vector<tinyusdz::value::TimeSamples::Sample,std::allocator<tinyusdz::value::TimeSamples::Sample>>>>
                                     ((__normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
                                       )local_d0,local_a0);
                plVar6 = std::min<long>(local_c0,&local_c8);
                psVar7 = (size_type *)std::max<long>(local_c0 + 1,plVar6);
                local_c0[2] = *psVar7;
                local_f0[1] = 0;
                sVar5 = std::
                        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ::size(this_00);
                local_f0[0] = sVar5 - 1;
                tl = (double)(local_c0[2] + 1);
                plVar6 = std::min<long>(local_f0,(long *)&tl);
                psVar7 = (size_type *)std::max<long>(local_f0 + 1,plVar6);
                local_f0[2] = *psVar7;
                pvVar8 = std::
                         vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         ::operator[](this_00,local_c0[2]);
                tu = pvVar8->t;
                pvVar8 = std::
                         vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         ::operator[](this_00,local_f0[2]);
                dt = pvVar8->t;
                local_110 = dStack_20 - tu;
                dVar11 = dt - tu;
                dVar12 = std::numeric_limits<double>::epsilon();
                if (dVar12 <= ABS(dVar11)) {
                  local_110 = local_110 / (dt - tu);
                }
                else {
                  local_110 = 0.0;
                }
                local_118 = 0.0;
                p0 = (Value *)0x3ff0000000000000;
                pdVar9 = std::min<double>((double *)&p0,&local_110);
                pdVar9 = std::max<double>(&local_118,pdVar9);
                local_110 = *pdVar9;
                pvVar8 = std::
                         vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         ::operator[](this_00,local_c0[2]);
                pvVar10 = std::
                          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                          ::operator[](this_00,local_f0[2]);
                bVar1 = tinyusdz::value::Lerp(&pvVar8->value,&pvVar10->value,local_110,local_30);
                return bVar1;
              }
            }
            cVar2 = std::
                    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ::begin(this_00);
            cVar3 = std::
                    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ::end(this_00);
            local_50 = std::
                       upper_bound<__gnu_cxx::__normal_iterator<tinyusdz::value::TimeSamples::Sample_const*,std::vector<tinyusdz::value::TimeSamples::Sample,std::allocator<tinyusdz::value::TimeSamples::Sample>>>,double,tinyusdz::primvar::PrimVar::get_interpolated_value(double,tinyusdz::value::TimeSampleInterpolationType,tinyusdz::value::Value*)const::__0>
                                 (cVar2._M_current,cVar3._M_current,&stack0xffffffffffffffe0);
            it_1._M_current =
                 (Sample *)
                 std::
                 vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ::begin(this_00);
            bVar1 = __gnu_cxx::operator==(&local_50,&it_1);
            if (bVar1) {
              local_70._M_current =
                   (Sample *)
                   std::
                   vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ::begin(this_00);
            }
            else {
              local_70 = __gnu_cxx::
                         __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
                         ::operator-(&local_50,1);
            }
            pSVar4 = __gnu_cxx::
                     __normal_iterator<const_tinyusdz::value::TimeSamples::Sample_*,_std::vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>_>
                     ::operator->(&local_70);
            tinyusdz::value::Value::operator=(local_30,&pSVar4->value);
            this_local._7_1_ = true;
          }
        }
      }
      else {
        bVar1 = has_default(this);
        if (bVar1) {
          tinyusdz::value::Value::operator=(local_30,&this->_value);
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool PrimVar::get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, value::Value *dst) const {

  if (is_blocked()) {
    return false;
  }

  if (value::TimeCode(t).is_default()) {
    if (has_default()) {
      (*dst) = _value;
      return true;
    }
  }

  if (has_timesamples()) {
    const std::vector<value::TimeSamples::Sample> &samples = _ts.get_samples();

    if (samples.empty()) {
      // ???
      return false;
    }

    if (value::TimeCode(t).is_default())  {
      // FIXME: Use the first item for now.
      if (samples[0].blocked) {
        return false;
      }

      (*dst) = samples[0].value;
      return true;
    } else {

      if (tinterp == value::TimeSampleInterpolationType::Held || !value::IsLerpSupportedType(_value.type_id())) {

        auto it = std::upper_bound(
          samples.begin(), samples.end(), t,
          [](double tval, const value::TimeSamples::Sample &a) { return tval < a.t; });

        const auto it_minus_1 = (it == samples.begin()) ? samples.begin() : (it - 1);

        (*dst) = it_minus_1->value;
        return true;

      } else { // Lerp 

        // TODO: Unify code in prim-types.hh
        auto it = std::lower_bound(
            samples.begin(), samples.end(), t,
            [](const value::TimeSamples::Sample &a, double tval) { return a.t < tval; });

        const auto it_minus_1 = (it == samples.begin()) ? samples.begin() : (it - 1);

        size_t idx0 = size_t(std::max(
            int64_t(0),
            std::min(int64_t(samples.size() - 1),
                     int64_t(std::distance(samples.begin(), it_minus_1)))));
        size_t idx1 =
            size_t(std::max(int64_t(0), std::min(int64_t(samples.size() - 1),
                                                 int64_t(idx0) + 1)));

        double tl = samples[idx0].t;
        double tu = samples[idx1].t;

        double dt = (t - tl);
        if (std::fabs(tu - tl) < std::numeric_limits<double>::epsilon()) {
          // slope is zero.
          dt = 0.0;
        } else {
          dt /= (tu - tl);
        }

        // Just in case.
        dt = std::max(0.0, std::min(1.0, dt));

        const value::Value &p0 = samples[idx0].value;
        const value::Value &p1 = samples[idx1].value;

        bool ret = value::Lerp(p0, p1, dt, dst);
        return ret;
      }
    }
  }

  if (has_default()) {
    (*dst) = _value;
    return true;
  }

  return false;
}